

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O0

optional<uint256> * detail::FromHex<uint256>(string_view str)

{
  long lVar1;
  string_view str_00;
  bool bVar2;
  uint uVar3;
  optional<uint256> *this;
  optional<uint256> *poVar4;
  char *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000030;
  uint256 rv;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  size_t in_stack_ffffffffffffffb0;
  base_blob<256U> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __t = in_RDI;
  uVar3 = base_blob<256U>::size();
  this = (optional<uint256> *)(ulong)(uVar3 << 1);
  poVar4 = (optional<uint256> *)std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (this == poVar4) {
    str_00._M_str = in_RSI;
    str_00._M_len = in_stack_ffffffffffffffb0;
    bVar2 = IsHex(str_00);
    if (bVar2) {
      uint256::uint256((uint256 *)in_RDI);
      base_blob<256U>::SetHexDeprecated(in_stack_ffffffffffffffe0,in_stack_00000030);
      std::optional<uint256>::optional<uint256,_true>(this,(uint256 *)__t);
      goto LAB_003f1490;
    }
  }
  std::optional<uint256>::optional((optional<uint256> *)in_RDI);
LAB_003f1490:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<uint256> *)__t;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uintN_t> FromHex(std::string_view str)
{
    if (uintN_t::size() * 2 != str.size() || !IsHex(str)) return std::nullopt;
    uintN_t rv;
    rv.SetHexDeprecated(str);
    return rv;
}